

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void calc_mean_and_sd_t<double,double>
               (size_t *ix_arr,size_t st,size_t end,double *x,MissingAction missing_action,
               double *x_sd,double *x_mean)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  int in_R8D;
  double *in_R9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double *in_stack_00000008;
  size_t row_1;
  size_t cnt;
  size_t row;
  double xval;
  double m_prev;
  double s;
  double m;
  byte local_6a;
  ulong local_68;
  long local_60;
  ulong local_58;
  double local_48;
  double local_40;
  double local_38;
  ulong local_10;
  
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = *(double *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 8);
  if (in_R8D == 0) {
    local_48 = *(double *)(in_RCX + *(long *)(in_RDI + in_RSI * 8) * 8);
    for (local_58 = in_RSI; local_58 <= in_RDX; local_58 = local_58 + 1) {
      dVar1 = *(double *)(in_RCX + *(long *)(in_RDI + local_58 * 8) * 8);
      lVar5 = (local_58 - in_RSI) + 1;
      auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar6._0_8_ = lVar5;
      auVar6._12_4_ = 0x45300000;
      local_38 = (dVar1 - local_38) /
                 ((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) + local_38;
      local_40 = fma(dVar1 - local_38,dVar1 - local_48,local_40);
      local_48 = local_38;
    }
    *in_stack_00000008 = local_38;
    lVar5 = (in_RDX - in_RSI) + 1;
    auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = 0x45300000;
    *in_R9 = SQRT(local_40 /
                  ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)));
    return;
  }
  local_60 = 0;
  local_10 = in_RSI;
  do {
    uVar3 = std::isnan(local_48);
    if ((uVar3 & 1) == 0) {
      uVar3 = std::isinf(local_48);
      bVar2 = false;
      if ((uVar3 & 1) != 0) goto LAB_00233f11;
    }
    else {
LAB_00233f11:
      bVar2 = local_10 <= in_RDX;
    }
    if (!bVar2) {
      for (local_68 = local_10; local_68 <= in_RDX; local_68 = local_68 + 1) {
        dVar1 = *(double *)(in_RCX + *(long *)(in_RDI + local_68 * 8) * 8);
        uVar3 = std::isnan(dVar1);
        local_6a = 1;
        if ((uVar3 & 1) == 0) {
          iVar4 = std::isinf(dVar1);
          local_6a = (byte)iVar4;
        }
        if (((local_6a ^ 0xff) & 1) != 0) {
          local_60 = local_60 + 1;
          auVar8._8_4_ = (int)((ulong)local_60 >> 0x20);
          auVar8._0_8_ = local_60;
          auVar8._12_4_ = 0x45300000;
          local_38 = (dVar1 - local_38) /
                     ((auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_60) - 4503599627370496.0)) + local_38;
          local_40 = fma(dVar1 - local_38,dVar1 - local_48,local_40);
          local_48 = local_38;
        }
      }
      *in_stack_00000008 = local_38;
      auVar9._8_4_ = (int)((ulong)local_60 >> 0x20);
      auVar9._0_8_ = local_60;
      auVar9._12_4_ = 0x45300000;
      *in_R9 = SQRT(local_40 /
                    ((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_60) - 4503599627370496.0)));
      return;
    }
    local_48 = *(double *)(in_RCX + *(long *)(in_RDI + 8 + local_10 * 8) * 8);
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void calc_mean_and_sd_t(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x,
                        MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = x[ix_arr[st]];
    real_t xval;

    if (missing_action == Fail)
    {
        m_prev = x[ix_arr[st]];
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            m += (xval - m) / (real_t)(row - st + 1);
            s  = std::fma(xval - m, xval - m_prev, s);
            m_prev = m;
        }

        x_mean = m;
        x_sd   = std::sqrt(s / (real_t)(end - st + 1));
    }

    else
    {
        size_t cnt = 0;
        while (is_na_or_inf(m_prev) && st <= end)
        {
            m_prev = x[ix_arr[++st]];
        }

        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            if (likely(!is_na_or_inf(xval)))
            {
                cnt++;
                m += (xval - m) / (real_t)cnt;
                s  = std::fma(xval - m, xval - m_prev, s);
                m_prev = m;
            }
        }

        x_mean = m;
        x_sd   = std::sqrt(s / (real_t)cnt);
    }
}